

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O2

TestCaseGroup * vkt::SpirVAssembly::createOpPhiTests(TestContext *testCtx)

{
  TestCaseGroup *pTVar1;
  mapped_type *pmVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  byte bVar6;
  allocator<char> local_e49;
  key_type local_e48;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  RGBA inputColors [4];
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  string local_dd8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fragments3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fragments2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fragments1;
  char typesAndConstants2 [34];
  char typesAndConstants3 [103];
  char function3 [864];
  char typesAndConstants1 [133];
  char function2 [826];
  char function1 [1346];
  
  bVar6 = 0;
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar1,testCtx,"opphi","Test the OpPhi instruction");
  inputColors[0].m_value = 0;
  inputColors[1].m_value = 0;
  inputColors[2].m_value = 0;
  inputColors[3].m_value = 0;
  local_de8._0_4_ = 0;
  local_de8._4_4_ = 0;
  uStack_de0._0_4_ = 0;
  uStack_de0._4_4_ = 0;
  local_df8._0_4_ = 0;
  local_df8._4_4_ = 0;
  uStack_df0._0_4_ = 0;
  uStack_df0._4_4_ = 0;
  local_e08._0_4_ = 0;
  local_e08._4_4_ = 0;
  uStack_e00._0_4_ = 0;
  uStack_e00._4_4_ = 0;
  fragments1._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &fragments1._M_t._M_impl.super__Rb_tree_header._M_header;
  fragments1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fragments1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fragments1._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  fragments2._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &fragments2._M_t._M_impl.super__Rb_tree_header._M_header;
  fragments2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fragments2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fragments2._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  fragments3._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &fragments3._M_t._M_impl.super__Rb_tree_header._M_header;
  fragments3._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fragments3._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fragments3._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       pTVar1;
  fragments3._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       fragments3._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  fragments2._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       fragments2._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  fragments1._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       fragments1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  memcpy(typesAndConstants1,
         "%c_f32_p2  = OpConstant %f32 0.2\n%c_f32_p4  = OpConstant %f32 0.4\n%c_f32_p5  = OpConstant %f32 0.5\n%c_f32_p8  = OpConstant %f32 0.8\n"
         ,0x85);
  memcpy(function1,
         "%test_code = OpFunction %v4f32 None %v4f32_function\n%param1    = OpFunctionParameter %v4f32\n%lbl       = OpLabel\n%iptr      = OpVariable %fp_i32 Function\n%result    = OpVariable %fp_v4f32 Function\n             OpStore %iptr %c_i32_0\n             OpStore %result %param1\n             OpBranch %loop\n%loop      = OpLabel\n%ival      = OpLoad %i32 %iptr\n%lt_4      = OpSLessThan %bool %ival %c_i32_4\n             OpLoopMerge %exit %phi None\n             OpBranchConditional %lt_4 %entry %exit\n%entry     = OpLabel\n%loc       = OpAccessChain %fp_f32 %result %ival\n%val       = OpLoad %f32 %loc\n             OpSelectionMerge %phi None\n             OpSwitch %ival %default 0 %case0 1 %case1 2 %case2 3 %case3\n%case0     = OpLabel\n             OpBranch %phi\n%case1     = OpLabel\n             OpBranch %phi\n%case2     = OpLabel\n             OpBranch %phi\n%case3     = OpLabel\n             OpBranch %phi\n%default   = OpLabel\n             OpUnreachable\n%phi       = OpLabel\n%operand   = OpPhi %f32 %c_f32_p4 %case2 %c_f32_p5 %case1 %c_f32_p2 %case0 %c_f32_0 %case3\n%add       = OpFAdd %f32 %val %operand\n             OpStore %loc %add\n%ival_next = OpIAdd %i32 %ival %c_i32_1\n             OpStore %iptr %ival_next\n             OpBranch %loop\n%exit      = OpLabel\n%ret       = OpLoad %v4f32 %result\n             OpReturnValue %ret\n             OpFunctionEnd\n"
         ,0x542);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)function3,"pre_main",(allocator<char> *)function2);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&fragments1,(key_type *)function3);
  std::__cxx11::string::assign((char *)pmVar2);
  std::__cxx11::string::~string((string *)function3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)function3,"testfun",(allocator<char> *)function2);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&fragments1,(key_type *)function3);
  std::__cxx11::string::assign((char *)pmVar2);
  std::__cxx11::string::~string((string *)function3);
  getHalfColorsFullAlpha(&inputColors);
  local_de8._0_4_ = 0xffe5ffb2;
  local_de8._4_4_ = 0xff667fb2;
  uStack_de0._0_4_ = 0xff66ff33;
  uStack_de0._4_4_ = 0xffe57f33;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)function3,"out_of_order",(allocator<char> *)typesAndConstants3);
  function2._0_8_ = function2 + 0x10;
  function2[8] = '\0';
  function2[9] = '\0';
  function2[10] = '\0';
  function2[0xb] = '\0';
  function2[0xc] = '\0';
  function2[0xd] = '\0';
  function2[0xe] = '\0';
  function2[0xf] = '\0';
  function2[0x10] = '\0';
  createTestsForAllStages
            ((string *)function3,&inputColors,(RGBA (*) [4])&local_de8,&fragments1,
             group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
             m_data.ptr,QP_TEST_RESULT_FAIL,(string *)function2);
  std::__cxx11::string::~string((string *)function2);
  std::__cxx11::string::~string((string *)function3);
  memcpy(function2,
         "%test_code = OpFunction %v4f32 None %v4f32_function\n%param     = OpFunctionParameter %v4f32\n%entry     = OpLabel\n%result    = OpVariable %fp_v4f32 Function\n             OpStore %result %param\n%loc       = OpAccessChain %fp_f32 %result %c_i32_1\n%val       = OpLoad %f32 %loc\n             OpBranch %phi\n%phi        = OpLabel\n%step       = OpPhi %i32 %c_i32_0  %entry %step_next  %phi\n%accum      = OpPhi %f32 %val      %entry %accum_next %phi\n%step_next  = OpIAdd %i32 %step  %c_i32_1\n%accum_next = OpFAdd %f32 %accum %c_f32_p2\n%still_loop = OpSLessThan %bool %step %c_i32_2\n              OpLoopMerge %exit %phi None\n              OpBranchConditional %still_loop %phi %exit\n%exit       = OpLabel\n              OpStore %loc %accum\n%ret        = OpLoad %v4f32 %result\n              OpReturnValue %ret\n              OpFunctionEnd\n"
         ,0x33a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)function3,"pre_main",(allocator<char> *)typesAndConstants3);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&fragments2,(key_type *)function3);
  std::__cxx11::string::assign((char *)pmVar2);
  std::__cxx11::string::~string((string *)function3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)function3,"testfun",(allocator<char> *)typesAndConstants3);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&fragments2,(key_type *)function3);
  std::__cxx11::string::assign((char *)pmVar2);
  std::__cxx11::string::~string((string *)function3);
  local_df8._0_4_ = 0xff7fe57f;
  local_df8._4_4_ = 0xff00667f;
  uStack_df0._0_4_ = 0xff00e500;
  uStack_df0._4_4_ = 0xff7f6600;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)function3,"induction",(allocator<char> *)&local_e48);
  typesAndConstants3._0_8_ = typesAndConstants3 + 0x10;
  typesAndConstants3[8] = '\0';
  typesAndConstants3[9] = '\0';
  typesAndConstants3[10] = '\0';
  typesAndConstants3[0xb] = '\0';
  typesAndConstants3[0xc] = '\0';
  typesAndConstants3[0xd] = '\0';
  typesAndConstants3[0xe] = '\0';
  typesAndConstants3[0xf] = '\0';
  typesAndConstants3[0x10] = '\0';
  createTestsForAllStages
            ((string *)function3,&inputColors,(RGBA (*) [4])&local_df8,&fragments2,
             group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
             m_data.ptr,QP_TEST_RESULT_FAIL,(string *)typesAndConstants3);
  std::__cxx11::string::~string((string *)typesAndConstants3);
  std::__cxx11::string::~string((string *)function3);
  pcVar4 = 
  "%true      = OpConstantTrue %bool\n%false     = OpConstantFalse %bool\n%c_f32_p2  = OpConstant %f32 0.2\n"
  ;
  pcVar5 = typesAndConstants3;
  for (lVar3 = 0x67; lVar3 != 0; lVar3 = lVar3 + -1) {
    *pcVar5 = *pcVar4;
    pcVar4 = pcVar4 + (ulong)bVar6 * -2 + 1;
    pcVar5 = pcVar5 + (ulong)bVar6 * -2 + 1;
  }
  memcpy(function3,
         "%test_code = OpFunction %v4f32 None %v4f32_function\n%param     = OpFunctionParameter %v4f32\n%entry     = OpLabel\n%result    = OpVariable %fp_v4f32 Function\n             OpStore %result %param\n%a_loc     = OpAccessChain %fp_f32 %result %c_i32_1\n%a_init    = OpLoad %f32 %a_loc\n%b_loc     = OpAccessChain %fp_f32 %result %c_i32_2\n%b_init    = OpLoad %f32 %b_loc\n             OpBranch %phi\n%phi        = OpLabel\n%still_loop = OpPhi %bool %true   %entry %false  %phi\n%a_next     = OpPhi %f32  %a_init %entry %b_next %phi\n%b_next     = OpPhi %f32  %b_init %entry %a_next %phi\n              OpLoopMerge %exit %phi None\n              OpBranchConditional %still_loop %phi %exit\n%exit       = OpLabel\n              OpStore %a_loc %a_next\n              OpStore %b_loc %b_next\n%ret        = OpLoad %v4f32 %result\n              OpReturnValue %ret\n              OpFunctionEnd\n"
         ,0x360);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e48,"pre_main",(allocator<char> *)&local_dd8);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&fragments3,&local_e48);
  std::__cxx11::string::assign((char *)pmVar2);
  std::__cxx11::string::~string((string *)&local_e48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e48,"testfun",(allocator<char> *)&local_dd8);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&fragments3,&local_e48);
  std::__cxx11::string::assign((char *)pmVar2);
  std::__cxx11::string::~string((string *)&local_e48);
  local_e08._0_4_ = 0xff7f7f7f;
  local_e08._4_4_ = 0xff00007f;
  uStack_e00._0_4_ = 0xff7f0000;
  uStack_e00._4_4_ = 0xff007f00;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e48,"swap",&local_e49);
  local_dd8._M_dataplus._M_p = (pointer)&local_dd8.field_2;
  local_dd8._M_string_length = 0;
  local_dd8.field_2._M_local_buf[0] = '\0';
  createTestsForAllStages
            (&local_e48,&inputColors,(RGBA (*) [4])&local_e08,&fragments3,
             group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
             m_data.ptr,QP_TEST_RESULT_FAIL,&local_dd8);
  std::__cxx11::string::~string((string *)&local_dd8);
  std::__cxx11::string::~string((string *)&local_e48);
  pTVar1 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&fragments3._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&fragments2._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&fragments1._M_t);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createOpPhiTests(tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> group				(new tcu::TestCaseGroup(testCtx, "opphi", "Test the OpPhi instruction"));
	RGBA							inputColors[4];
	RGBA							outputColors1[4];
	RGBA							outputColors2[4];
	RGBA							outputColors3[4];
	map<string, string>				fragments1;
	map<string, string>				fragments2;
	map<string, string>				fragments3;

	const char	typesAndConstants1[]	=
		"%c_f32_p2  = OpConstant %f32 0.2\n"
		"%c_f32_p4  = OpConstant %f32 0.4\n"
		"%c_f32_p5  = OpConstant %f32 0.5\n"
		"%c_f32_p8  = OpConstant %f32 0.8\n";

	// vec4 test_code(vec4 param) {
	//   vec4 result = param;
	//   for (int i = 0; i < 4; ++i) {
	//     float operand;
	//     switch (i) {
	//       case 0: operand = .2; break;
	//       case 1: operand = .5; break;
	//       case 2: operand = .4; break;
	//       case 3: operand = .0; break;
	//       default: break; // unreachable
	//     }
	//     result[i] += operand;
	//   }
	//   return result;
	// }
	const char	function1[]				=
		"%test_code = OpFunction %v4f32 None %v4f32_function\n"
		"%param1    = OpFunctionParameter %v4f32\n"
		"%lbl       = OpLabel\n"
		"%iptr      = OpVariable %fp_i32 Function\n"
		"%result    = OpVariable %fp_v4f32 Function\n"
		"             OpStore %iptr %c_i32_0\n"
		"             OpStore %result %param1\n"
		"             OpBranch %loop\n"

		"%loop      = OpLabel\n"
		"%ival      = OpLoad %i32 %iptr\n"
		"%lt_4      = OpSLessThan %bool %ival %c_i32_4\n"
		"             OpLoopMerge %exit %phi None\n"
		"             OpBranchConditional %lt_4 %entry %exit\n"

		"%entry     = OpLabel\n"
		"%loc       = OpAccessChain %fp_f32 %result %ival\n"
		"%val       = OpLoad %f32 %loc\n"
		"             OpSelectionMerge %phi None\n"
		"             OpSwitch %ival %default 0 %case0 1 %case1 2 %case2 3 %case3\n"

		"%case0     = OpLabel\n"
		"             OpBranch %phi\n"
		"%case1     = OpLabel\n"
		"             OpBranch %phi\n"
		"%case2     = OpLabel\n"
		"             OpBranch %phi\n"
		"%case3     = OpLabel\n"
		"             OpBranch %phi\n"

		"%default   = OpLabel\n"
		"             OpUnreachable\n"

		"%phi       = OpLabel\n"
		"%operand   = OpPhi %f32 %c_f32_p4 %case2 %c_f32_p5 %case1 %c_f32_p2 %case0 %c_f32_0 %case3\n" // not in the order of blocks
		"%add       = OpFAdd %f32 %val %operand\n"
		"             OpStore %loc %add\n"
		"%ival_next = OpIAdd %i32 %ival %c_i32_1\n"
		"             OpStore %iptr %ival_next\n"
		"             OpBranch %loop\n"

		"%exit      = OpLabel\n"
		"%ret       = OpLoad %v4f32 %result\n"
		"             OpReturnValue %ret\n"

		"             OpFunctionEnd\n";

	fragments1["pre_main"]	= typesAndConstants1;
	fragments1["testfun"]	= function1;

	getHalfColorsFullAlpha(inputColors);

	outputColors1[0]		= RGBA(178, 255, 229, 255);
	outputColors1[1]		= RGBA(178, 127, 102, 255);
	outputColors1[2]		= RGBA(51,  255, 102, 255);
	outputColors1[3]		= RGBA(51,  127, 229, 255);

	createTestsForAllStages("out_of_order", inputColors, outputColors1, fragments1, group.get());

	const char	typesAndConstants2[]	=
		"%c_f32_p2  = OpConstant %f32 0.2\n";

	// Add .4 to the second element of the given parameter.
	const char	function2[]				=
		"%test_code = OpFunction %v4f32 None %v4f32_function\n"
		"%param     = OpFunctionParameter %v4f32\n"
		"%entry     = OpLabel\n"
		"%result    = OpVariable %fp_v4f32 Function\n"
		"             OpStore %result %param\n"
		"%loc       = OpAccessChain %fp_f32 %result %c_i32_1\n"
		"%val       = OpLoad %f32 %loc\n"
		"             OpBranch %phi\n"

		"%phi        = OpLabel\n"
		"%step       = OpPhi %i32 %c_i32_0  %entry %step_next  %phi\n"
		"%accum      = OpPhi %f32 %val      %entry %accum_next %phi\n"
		"%step_next  = OpIAdd %i32 %step  %c_i32_1\n"
		"%accum_next = OpFAdd %f32 %accum %c_f32_p2\n"
		"%still_loop = OpSLessThan %bool %step %c_i32_2\n"
		"              OpLoopMerge %exit %phi None\n"
		"              OpBranchConditional %still_loop %phi %exit\n"

		"%exit       = OpLabel\n"
		"              OpStore %loc %accum\n"
		"%ret        = OpLoad %v4f32 %result\n"
		"              OpReturnValue %ret\n"

		"              OpFunctionEnd\n";

	fragments2["pre_main"]	= typesAndConstants2;
	fragments2["testfun"]	= function2;

	outputColors2[0]			= RGBA(127, 229, 127, 255);
	outputColors2[1]			= RGBA(127, 102, 0,   255);
	outputColors2[2]			= RGBA(0,   229, 0,   255);
	outputColors2[3]			= RGBA(0,   102, 127, 255);

	createTestsForAllStages("induction", inputColors, outputColors2, fragments2, group.get());

	const char	typesAndConstants3[]	=
		"%true      = OpConstantTrue %bool\n"
		"%false     = OpConstantFalse %bool\n"
		"%c_f32_p2  = OpConstant %f32 0.2\n";

	// Swap the second and the third element of the given parameter.
	const char	function3[]				=
		"%test_code = OpFunction %v4f32 None %v4f32_function\n"
		"%param     = OpFunctionParameter %v4f32\n"
		"%entry     = OpLabel\n"
		"%result    = OpVariable %fp_v4f32 Function\n"
		"             OpStore %result %param\n"
		"%a_loc     = OpAccessChain %fp_f32 %result %c_i32_1\n"
		"%a_init    = OpLoad %f32 %a_loc\n"
		"%b_loc     = OpAccessChain %fp_f32 %result %c_i32_2\n"
		"%b_init    = OpLoad %f32 %b_loc\n"
		"             OpBranch %phi\n"

		"%phi        = OpLabel\n"
		"%still_loop = OpPhi %bool %true   %entry %false  %phi\n"
		"%a_next     = OpPhi %f32  %a_init %entry %b_next %phi\n"
		"%b_next     = OpPhi %f32  %b_init %entry %a_next %phi\n"
		"              OpLoopMerge %exit %phi None\n"
		"              OpBranchConditional %still_loop %phi %exit\n"

		"%exit       = OpLabel\n"
		"              OpStore %a_loc %a_next\n"
		"              OpStore %b_loc %b_next\n"
		"%ret        = OpLoad %v4f32 %result\n"
		"              OpReturnValue %ret\n"

		"              OpFunctionEnd\n";

	fragments3["pre_main"]	= typesAndConstants3;
	fragments3["testfun"]	= function3;

	outputColors3[0]			= RGBA(127, 127, 127, 255);
	outputColors3[1]			= RGBA(127, 0,   0,   255);
	outputColors3[2]			= RGBA(0,   0,   127, 255);
	outputColors3[3]			= RGBA(0,   127, 0,   255);

	createTestsForAllStages("swap", inputColors, outputColors3, fragments3, group.get());

	return group.release();
}